

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O2

asn_dec_rval_t
SET_OF_decode_ber(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 void *ptr,size_t size,int tag_mode)

{
  asn_struct_ctx_t *opt_ctx;
  ber_tlv_len_t *last_length;
  void **ppvVar1;
  short sVar2;
  asn_TYPE_member_s *paVar3;
  int *piVar4;
  asn_dec_rval_t aVar5;
  asn_dec_rval_t aVar6;
  undefined1 auVar7 [16];
  int iVar8;
  long lVar9;
  ssize_t sVar10;
  ulong uVar11;
  asn_dec_rval_t aVar15;
  long extraout_RDX;
  size_t num;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  undefined8 uStack_70;
  ber_tlv_tag_t tlv_tag;
  asn_codec_ctx_t *local_40;
  void *local_38;
  
  paVar3 = td->elements;
  piVar4 = (int *)td->specifics;
  local_38 = *struct_ptr;
  if (local_38 == (void *)0x0) {
    local_38 = calloc(1,(long)*piVar4);
    *struct_ptr = local_38;
    if (local_38 != (void *)0x0) goto LAB_00144e19;
    uVar12 = 0;
  }
  else {
LAB_00144e19:
    lVar9 = (long)piVar4[1];
    opt_ctx = (asn_struct_ctx_t *)((long)local_38 + lVar9);
    sVar2 = *(short *)((long)local_38 + lVar9);
    uVar12 = 0;
    if (sVar2 == 0) {
      last_length = &opt_ctx->left;
      aVar15 = ber_check_tags(opt_codec_ctx,td,opt_ctx,ptr,size,tag_mode,1,last_length,(int *)0x0);
      uVar12 = aVar15.consumed;
      if (aVar15.code != RC_OK) {
        return aVar15;
      }
      uVar13 = *last_length;
      if (-1 < (long)uVar13) {
        if ((long)(uVar13 + uVar12) < 0) {
          uVar13 = uVar13 + uVar12;
        }
        *last_length = uVar13;
      }
      ptr = (void *)((long)ptr + uVar12);
      size = size - uVar12;
      opt_ctx->phase = opt_ctx->phase + 1;
      opt_ctx->step = 0;
      bVar14 = true;
    }
    else {
      if (sVar2 == 2) {
        uVar13 = opt_ctx->left;
        uVar12 = 0;
LAB_00144e63:
        do {
          if (-1 < (long)uVar13) goto LAB_00145057;
          if (size < 2) {
            if ((size == 0) || (*ptr == '\0')) goto LAB_001450fe;
            goto LAB_001450da;
          }
          if ((*ptr != '\0') || (*(char *)((long)ptr + 1) != '\0')) goto LAB_001450da;
          ptr = (void *)((long)ptr + 2);
          uVar12 = uVar12 + 2;
          uVar13 = uVar13 + 1;
          opt_ctx->left = uVar13;
          size = size - 2;
        } while( true );
      }
      if (sVar2 != 1) {
LAB_0014505e:
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar12;
        return (asn_dec_rval_t)(auVar7 << 0x40);
      }
      uVar13 = opt_ctx->left;
      bVar14 = (opt_ctx->step & 1) == 0;
      uVar12 = 0;
    }
    ppvVar1 = &opt_ctx->ptr;
    local_40 = opt_codec_ctx;
LAB_00144f1b:
    if (bVar14) {
      if (uVar13 == 0) goto LAB_00145057;
      if (size < uVar13) {
        uVar13 = size;
      }
      sVar10 = ber_fetch_tag(ptr,uVar13,&tlv_tag);
      if (sVar10 == -1) goto LAB_001450da;
      if (sVar10 == 0) {
        aVar15._4_4_ = 0;
        aVar15.code = 2 - (size < (ulong)opt_ctx->left || opt_ctx->left < 0);
        aVar15.consumed = uVar12;
        return aVar15;
      }
      uVar13 = opt_ctx->left;
      if (((long)uVar13 < 0) && (*ptr == '\0')) {
        uVar11 = uVar13;
        if (size < uVar13) {
          uVar11 = size;
        }
        if (uVar11 < 2) goto LAB_001450fe;
        if (*(char *)((long)ptr + 1) == '\0') {
          opt_ctx->phase = opt_ctx->phase + 1;
          opt_ctx->step = 0;
          goto LAB_00144e63;
        }
      }
      if (tlv_tag != paVar3->tag && paVar3->tag != 0xffffffff) {
        ber_tlv_tag_string(tlv_tag);
        ber_tlv_tag_string(paVar3->tag);
        goto LAB_001450da;
      }
      *(byte *)&opt_ctx->step = (byte)opt_ctx->step | 1;
    }
    if (size < uVar13) {
      uVar13 = size;
    }
    aVar15.code = (*paVar3->type->ber_decoder)(local_40,paVar3->type,ppvVar1,ptr,uVar13,0);
    if (aVar15.code == (asn_dec_rval_t)0x0) {
      iVar8 = asn_set_add(local_38,*ppvVar1);
      if (iVar8 != 0) {
        aVar6.consumed = uVar12;
        aVar6._0_8_ = 2;
        return aVar6;
      }
      *ppvVar1 = (void *)0x0;
LAB_00145027:
      uVar13 = opt_ctx->left;
      if (-1 < (long)uVar13) {
        uVar13 = uVar13 - extraout_RDX;
        opt_ctx->left = uVar13;
      }
      ptr = (void *)((long)ptr + extraout_RDX);
      size = size - extraout_RDX;
      uVar12 = uVar12 + extraout_RDX;
      opt_ctx->step = 0;
      bVar14 = true;
      goto LAB_00144f1b;
    }
    if (aVar15.code != (asn_dec_rval_t)0x1) {
      if (aVar15.code == (asn_dec_rval_t)0x2) goto LAB_001450a9;
      goto LAB_00145027;
    }
    uVar13 = opt_ctx->left;
    if (((long)uVar13 < 0) || (size < uVar13)) {
      if (-1 < (long)uVar13) {
        opt_ctx->left = uVar13 - extraout_RDX;
      }
      uVar12 = uVar12 + extraout_RDX;
      goto LAB_001450fe;
    }
LAB_001450a9:
    (*paVar3->type->free_struct)(paVar3->type,*ppvVar1,0);
    *ppvVar1 = (void *)0x0;
  }
LAB_001450da:
  uStack_70 = 2;
LAB_001450dc:
  aVar5.consumed = uVar12;
  aVar5._0_8_ = uStack_70;
  return aVar5;
LAB_00145057:
  opt_ctx->phase = 10;
  goto LAB_0014505e;
LAB_001450fe:
  uStack_70 = 1;
  goto LAB_001450dc;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_ber(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const void *ptr, size_t size, int tag_mode) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;	/* Single one */

	/*
	 * Parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	ber_tlv_tag_t tlv_tag;	/* T from TLV */
	asn_dec_rval_t rval;	/* Return code from subparsers */

	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */

	ASN_DEBUG("Decoding %s as SET OF", td->name);
	
	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) {
			RETURN(RC_FAIL);
		}
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);
	
	/*
	 * Start to parse where left previously
	 */
	switch(ctx->phase) {
	case 0:
		/*
		 * PHASE 0.
		 * Check that the set of tags associated with given structure
		 * perfectly fits our expectations.
		 */

		rval = ber_check_tags(opt_codec_ctx, td, ctx, ptr, size,
			tag_mode, 1, &ctx->left, 0);
		if(rval.code != RC_OK) {
			ASN_DEBUG("%s tagging check failed: %d",
				td->name, rval.code);
			return rval;
		}

		if(ctx->left >= 0)
			ctx->left += rval.consumed; /* ?Substracted below! */
		ADVANCE(rval.consumed);

		ASN_DEBUG("Structure consumes %ld bytes, "
			"buffer %ld", (long)ctx->left, (long)size);

		NEXT_PHASE(ctx);
		/* Fall through */
	case 1:
		/*
		 * PHASE 1.
		 * From the place where we've left it previously,
		 * try to decode the next item.
		 */
	  for(;; ctx->step = 0) {
		ssize_t tag_len;	/* Length of TLV's T */

		if(ctx->step & 1)
			goto microphase2;

		/*
		 * MICROPHASE 1: Synchronize decoding.
		 */

		if(ctx->left == 0) {
			ASN_DEBUG("End of SET OF %s", td->name);
			/*
			 * No more things to decode.
			 * Exit out of here.
			 */
			PHASE_OUT(ctx);
			RETURN(RC_OK);
		}

		/*
		 * Fetch the T from TLV.
		 */
		tag_len = ber_fetch_tag(ptr, LEFT, &tlv_tag);
		switch(tag_len) {
		case 0: if(!SIZE_VIOLATION) RETURN(RC_WMORE);
			/* Fall through */
		case -1: RETURN(RC_FAIL);
		}

		if(ctx->left < 0 && ((const uint8_t *)ptr)[0] == 0) {
			if(LEFT < 2) {
				if(SIZE_VIOLATION)
					RETURN(RC_FAIL);
				else
					RETURN(RC_WMORE);
			} else if(((const uint8_t *)ptr)[1] == 0) {
				/*
				 * Found the terminator of the
				 * indefinite length structure.
				 */
				break;
			}
		}

		/* Outmost tag may be unknown and cannot be fetched/compared */
		if(elm->tag != (ber_tlv_tag_t)-1) {
		    if(BER_TAGS_EQUAL(tlv_tag, elm->tag)) {
			/*
			 * The new list member of expected type has arrived.
			 */
		    } else {
			ASN_DEBUG("Unexpected tag %s fixed SET OF %s",
				ber_tlv_tag_string(tlv_tag), td->name);
			ASN_DEBUG("%s SET OF has tag %s",
				td->name, ber_tlv_tag_string(elm->tag));
			RETURN(RC_FAIL);
		    }
		}

		/*
		 * MICROPHASE 2: Invoke the member-specific decoder.
		 */
		ctx->step |= 1;		/* Confirm entering next microphase */
	microphase2:
		
		/*
		 * Invoke the member fetch routine according to member's type
		 */
		rval = elm->type->ber_decoder(opt_codec_ctx,
				elm->type, &ctx->ptr, ptr, LEFT, 0);
		ASN_DEBUG("In %s SET OF %s code %d consumed %d",
			td->name, elm->type->name,
			rval.code, (int)rval.consumed);
		switch(rval.code) {
		case RC_OK:
			{
				asn_anonymous_set_ *list = _A_SET_FROM_VOID(st);
				if(ASN_SET_ADD(list, ctx->ptr) != 0)
					RETURN(RC_FAIL);
				else
					ctx->ptr = 0;
			}
			break;
		case RC_WMORE: /* More data expected */
			if(!SIZE_VIOLATION) {
				ADVANCE(rval.consumed);
				RETURN(RC_WMORE);
			}
			/* Fall through */
		case RC_FAIL: /* Fatal error */
			ASN_STRUCT_FREE(*elm->type, ctx->ptr);
			ctx->ptr = 0;
			RETURN(RC_FAIL);
		} /* switch(rval) */
		
		ADVANCE(rval.consumed);
	  }	/* for(all list members) */

		NEXT_PHASE(ctx);
	case 2:
		/*
		 * Read in all "end of content" TLVs.
		 */
		while(ctx->left < 0) {
			if(LEFT < 2) {
				if(LEFT > 0 && ((const char *)ptr)[0] != 0) {
					/* Unexpected tag */
					RETURN(RC_FAIL);
				} else {
					RETURN(RC_WMORE);
				}
			}
			if(((const char *)ptr)[0] == 0
			&& ((const char *)ptr)[1] == 0) {
				ADVANCE(2);
				ctx->left++;
			} else {
				RETURN(RC_FAIL);
			}
		}

		PHASE_OUT(ctx);
	}
	
	RETURN(RC_OK);
}